

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O1

void __thiscall
AActor::LinkToWorld(AActor *this,FLinkContext *ctx,bool spawningmapthing,sector_t *sector)

{
  double dVar1;
  double dVar2;
  AActor *pAVar3;
  FBlockNode *pFVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  subsector_t *psVar12;
  msecnode_t *pmVar13;
  FBlockNode *pFVar14;
  long lVar15;
  WORD *pWVar16;
  int iVar17;
  undefined7 in_register_00000011;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  FBlockNode **ppFVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  FBlockNode **ppFVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  FPortalGroupArray check;
  FPortalGroupArray local_70;
  DVector3 local_48;
  
  bVar8 = spawningmapthing;
  if ((((int)CONCAT71(in_register_00000011,spawningmapthing) != 0) && (sector == (sector_t *)0x0))
     && (((this->flags4).Value & 0x40) != 0)) {
    bVar7 = FixMapthingPos(this);
    bVar8 = ~bVar7 & spawningmapthing;
  }
  if (sector == (sector_t *)0x0) {
    dVar1 = (this->__Pos).X;
    dVar29 = (this->__Pos).Y;
    if ((bVar8 & numgamenodes != 0) == 0) {
      psVar12 = P_PointInSubsector(dVar1,dVar29);
      sector = (sector_t *)psVar12->sector;
    }
    else {
      sector = P_PointInSectorBuggy(dVar1,dVar29);
    }
  }
  this->Sector = sector;
  psVar12 = R_PointInSubsector(SUB84((this->__Pos).X + 103079215104.0,0),
                               SUB84((this->__Pos).Y + 103079215104.0,0));
  this->subsector = psVar12;
  if (((this->flags).Value & 8) == 0) {
    pAVar3 = ((sector_t_conflict *)sector)->thinglist;
    this->snext = pAVar3;
    if (pAVar3 != (AActor *)0x0) {
      pAVar3->sprev = &this->snext;
    }
    this->sprev = &((sector_t_conflict *)sector)->thinglist;
    ((sector_t_conflict *)sector)->thinglist = this;
    if (ctx == (FLinkContext *)0x0) {
      pmVar13 = (msecnode_t *)0x0;
    }
    else {
      pmVar13 = ctx->sector_list;
    }
    pmVar13 = P_CreateSecNodeList(this,this->radius,pmVar13,0x1c0);
    this->touching_sectorlist = pmVar13;
    dVar1 = this->renderradius;
    if (0.0 <= dVar1) {
      dVar29 = this->radius;
      if (this->radius <= dVar1) {
        dVar29 = dVar1;
      }
      if (ctx == (FLinkContext *)0x0) {
        pmVar13 = (msecnode_t *)0x0;
      }
      else {
        pmVar13 = ctx->render_list;
      }
      pmVar13 = P_CreateSecNodeList(this,dVar29,pmVar13,0x1d0);
      this->touching_rendersectors = pmVar13;
    }
    else {
      this->touching_rendersectors = (msecnode_t *)0x0;
      if (ctx != (FLinkContext *)0x0) {
        P_DelSeclist(ctx->render_list,0x1d0);
      }
    }
  }
  if (((this->flags).Value & 0x10) == 0) {
    local_70.data.Array = (unsigned_short *)0x0;
    local_70.data.Most = 0;
    local_70.data.Count = 0;
    local_70.method = 1;
    local_70.varused = 0;
    local_70.inited = false;
    local_48.X = (this->__Pos).X;
    local_48.Y = (this->__Pos).Y;
    local_48.Z = (this->__Pos).Z;
    P_CollectConnectedGroups
              (this->Sector->PortalGroup,&local_48,local_48.Z + this->Height,this->radius,&local_70)
    ;
    this->BlockNode = (FBlockNode *)0x0;
    dVar29 = bmaporgy;
    dVar1 = bmaporgx;
    iVar6 = bmapheight;
    iVar5 = bmapwidth;
    if (-1 < (int)(local_70.varused + local_70.data.Count)) {
      ppFVar24 = &this->BlockNode;
      lVar15 = (long)bmapwidth;
      iVar17 = bmapwidth + -1;
      iVar9 = bmapheight + -1;
      uVar20 = 0xffffffff;
      do {
        uVar19 = (uint)uVar20;
        if (uVar19 == 0xffffffff) {
          dVar31 = (this->__Pos).X;
          dVar30 = (this->__Pos).Y;
        }
        else {
          pWVar16 = local_70.entry + uVar20;
          if (3 < uVar19) {
            pWVar16 = local_70.data.Array + (uVar19 - 4);
          }
          uVar11 = this->Sector->PortalGroup;
          dVar31 = 0.0;
          dVar30 = 0.0;
          if (uVar11 != (*pWVar16 & 0x3fff)) {
            iVar10 = (*pWVar16 & 0x3fff) * Displacements.size + uVar11;
            dVar31 = Displacements.data.Array[iVar10].pos.X;
            dVar30 = Displacements.data.Array[iVar10].pos.Y;
          }
          dVar31 = dVar31 + (this->__Pos).X;
          dVar30 = dVar30 + (this->__Pos).Y;
        }
        dVar2 = this->radius;
        uVar11 = (uint)(((dVar31 - dVar2) - dVar1) * 0.0078125);
        if (((int)uVar11 < iVar5) &&
           (iVar10 = (int)(((dVar31 + dVar2) - dVar1) * 0.0078125), -1 < iVar10)) {
          iVar21 = (int)(((dVar30 + dVar2) - dVar29) * 0.0078125);
          if (-1 < iVar21) {
            uVar25 = (uint)(((dVar30 - dVar2) - dVar29) * 0.0078125);
            if ((int)uVar25 < iVar6) {
              if ((int)uVar25 < 1) {
                uVar25 = 0;
              }
              if (iVar9 < iVar21) {
                iVar21 = iVar9;
              }
              if ((int)uVar25 <= iVar21) {
                if (iVar17 < iVar10) {
                  iVar10 = iVar17;
                }
                if ((int)uVar11 < 1) {
                  uVar11 = 0;
                }
                uVar20 = (ulong)uVar25;
                iVar26 = uVar25 * iVar5 + uVar11;
                lVar22 = (lVar15 * uVar20 + (ulong)uVar11) * 8;
                do {
                  lVar18 = (ulong)(iVar10 + 1) - (ulong)uVar11;
                  lVar23 = lVar22;
                  iVar27 = iVar26;
                  if ((int)uVar11 <= iVar10) {
                    do {
                      ppFVar28 = (FBlockNode **)((long)blocklinks + lVar23);
                      if (FBlockNode::FreeBlocks == (FBlockNode *)0x0) {
                        pFVar14 = (FBlockNode *)operator_new(0x30);
                      }
                      else {
                        pFVar14 = FBlockNode::FreeBlocks;
                        FBlockNode::FreeBlocks = FBlockNode::FreeBlocks->NextBlock;
                      }
                      pFVar14->BlockIndex = iVar27;
                      pFVar14->Me = this;
                      pFVar14->PrevActor = (FBlockNode **)0x0;
                      pFVar14->NextActor = (FBlockNode *)0x0;
                      pFVar14->PrevBlock = (FBlockNode **)0x0;
                      pFVar14->NextBlock = (FBlockNode *)0x0;
                      pFVar4 = *ppFVar28;
                      pFVar14->NextActor = pFVar4;
                      if (pFVar4 != (FBlockNode *)0x0) {
                        (*ppFVar28)->PrevActor = &pFVar14->NextActor;
                      }
                      pFVar14->PrevActor = ppFVar28;
                      *ppFVar28 = pFVar14;
                      pFVar14->PrevBlock = ppFVar24;
                      pFVar14->NextBlock = (FBlockNode *)0x0;
                      *ppFVar24 = pFVar14;
                      ppFVar24 = &pFVar14->NextBlock;
                      iVar27 = iVar27 + 1;
                      lVar23 = lVar23 + 8;
                      lVar18 = lVar18 + -1;
                    } while (lVar18 != 0);
                  }
                  uVar20 = uVar20 + 1;
                  iVar26 = iVar26 + iVar5;
                  lVar22 = lVar22 + lVar15 * 8;
                } while (uVar20 != iVar21 + 1);
              }
            }
          }
        }
        uVar20 = (ulong)(uVar19 + 1);
      } while ((int)(uVar19 + 1) < (int)(local_70.varused + local_70.data.Count));
    }
    TArray<unsigned_short,_unsigned_short>::~TArray(&local_70.data);
  }
  if (!spawningmapthing) {
    UpdateRenderSectorList(this);
  }
  return;
}

Assistant:

void AActor::LinkToWorld(FLinkContext *ctx, bool spawningmapthing, sector_t *sector)
{
	bool spawning = spawningmapthing;

	if (spawning)
	{
		if ((flags4 & MF4_FIXMAPTHINGPOS) && sector == NULL)
		{
			if (FixMapthingPos()) spawning = false;
		}
	}

	if (sector == NULL)
	{
		if (!spawning || numgamenodes == 0)
		{
			sector = P_PointInSector(Pos());
		}
		else
		{
			sector = P_PointInSectorBuggy(X(), Y());
		}
	}

	Sector = sector;
	subsector = R_PointInSubsector(Pos());	// this is from the rendering nodes, not the gameplay nodes!

	if (!(flags & MF_NOSECTOR))
	{
		// invisible things don't go into the sector links
		// killough 8/11/98: simpler scheme using pointer-to-pointer prev
		// pointers, allows head nodes to be treated like everything else

		AActor **link = &sector->thinglist;
		AActor *next = *link;
		if ((snext = next))
			next->sprev = &snext;
		sprev = link;
		*link = this;

		// phares 3/16/98
		//
		// If sector_list isn't NULL, it has a collection of sector
		// nodes that were just removed from this Thing.

		// Collect the sectors the object will live in by looking at
		// the existing sector_list and adding new nodes and deleting
		// obsolete ones.

		// When a node is deleted, its sector links (the links starting
		// at sector_t->touching_thinglist) are broken. When a node is
		// added, new sector links are created.
		touching_sectorlist = P_CreateSecNodeList(this, radius, ctx != nullptr? ctx->sector_list : nullptr, &sector_t::touching_thinglist);	// Attach to thing
		if (renderradius >= 0) touching_rendersectors = P_CreateSecNodeList(this, MAX(radius, renderradius), ctx != nullptr ? ctx->render_list : nullptr, &sector_t::touching_renderthings);
		else
		{
			touching_rendersectors = nullptr;
			if (ctx != nullptr) P_DelSeclist(ctx->render_list, &sector_t::touching_renderthings);
		}
	}


	// link into blockmap (inert things don't need to be in the blockmap)
	if (!(flags & MF_NOBLOCKMAP))
	{
		FPortalGroupArray check;

		P_CollectConnectedGroups(Sector->PortalGroup, Pos(), Top(), radius, check);

		BlockNode = NULL;
		FBlockNode **alink = &this->BlockNode;
		for (int i = -1; i < (int)check.Size(); i++)
		{
			DVector3 pos = i==-1? Pos() : PosRelative(check[i] & ~FPortalGroupArray::FLAT);

			int x1 = GetBlockX(pos.X - radius);
			int x2 = GetBlockX(pos.X + radius);
			int y1 = GetBlockY(pos.Y - radius);
			int y2 = GetBlockY(pos.Y + radius);

			if (x1 >= bmapwidth || x2 < 0 || y1 >= bmapheight || y2 < 0)
			{ // thing is off the map
			}
			else
			{ // [RH] Link into every block this actor touches, not just the center one
				x1 = MAX(0, x1);
				y1 = MAX(0, y1);
				x2 = MIN(bmapwidth - 1, x2);
				y2 = MIN(bmapheight - 1, y2);
				for (int y = y1; y <= y2; ++y)
				{
					for (int x = x1; x <= x2; ++x)
					{
						FBlockNode **link = &blocklinks[y*bmapwidth + x];
						FBlockNode *node = FBlockNode::Create(this, x, y, this->Sector->PortalGroup);

						// Link in to block
						if ((node->NextActor = *link) != NULL)
						{
							(*link)->PrevActor = &node->NextActor;
						}
						node->PrevActor = link;
						*link = node;

						// Link in to actor
						node->PrevBlock = alink;
						node->NextBlock = NULL;
						(*alink) = node;
						alink = &node->NextBlock;
					}
				}
			}
		}
	}
	// Portal links cannot be done unless the level is fully initialized.
	if (!spawningmapthing) UpdateRenderSectorList();
}